

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LRUCache.hpp
# Opt level: O2

void __thiscall
sjtu::LRUCache<std::pair<sjtu::orderType,_long>_>::CacheNode::~CacheNode(CacheNode *this)

{
  map<long,_sjtu::LRUCache<std::pair<sjtu::orderType,_long>_>::CacheNode_*,_std::less<long>_>
  *this_00;
  iterator local_20;
  
  if (this->is_dirty_page == true) {
    f_write(this->bel,&this->offset,&this->value);
  }
  this_00 = &this->bel->table;
  local_20.ptr = map<long,_sjtu::LRUCache<std::pair<sjtu::orderType,_long>_>::CacheNode_*,_std::less<long>_>
                 ::search(this_00,&this->offset);
  local_20.cor = this_00;
  map<long,_sjtu::LRUCache<std::pair<sjtu::orderType,_long>_>::CacheNode_*,_std::less<long>_>::erase
            (this_00,&local_20);
  return;
}

Assistant:

~CacheNode()
			{
				if (is_dirty_page) bel -> f_write(offset , value);
				bel -> table.erase(bel -> table.find(offset));
			}